

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O2

int __thiscall S2EdgeCrosser::CrossingSign(S2EdgeCrosser *this,S2Point *d)

{
  bool bVar1;
  int iVar2;
  S2LogMessage local_20;
  
  bVar1 = S2::IsUnitLength(d);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
               ,0x108,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_20.stream_,"Check failed: S2::IsUnitLength(*d) ");
    abort();
  }
  iVar2 = s2pred::TriageSign(this->a_,this->b_,d,&this->a_cross_b_);
  if ((iVar2 != 0) && (this->acb_ == -iVar2)) {
    this->c_ = d;
    return -1;
  }
  this->bda_ = iVar2;
  iVar2 = CrossingSignInternal(this,d);
  return iVar2;
}

Assistant:

inline int S2EdgeCrosser::CrossingSign(const S2Point* d) {
  S2_DCHECK(S2::IsUnitLength(*d));
  // For there to be an edge crossing, the triangles ACB, CBD, BDA, DAC must
  // all be oriented the same way (CW or CCW).  We keep the orientation of ACB
  // as part of our state.  When each new point D arrives, we compute the
  // orientation of BDA and check whether it matches ACB.  This checks whether
  // the points C and D are on opposite sides of the great circle through AB.

  // Recall that TriageSign is invariant with respect to rotating its
  // arguments, i.e. ABD has the same orientation as BDA.
  int bda = s2pred::TriageSign(*a_, *b_, *d, a_cross_b_);
  if (acb_ == -bda && bda != 0) {
    // The most common case -- triangles have opposite orientations.  Save the
    // current vertex D as the next vertex C, and also save the orientation of
    // the new triangle ACB (which is opposite to the current triangle BDA).
    c_ = d;
    acb_ = -bda;
    return -1;
  }
  bda_ = bda;
  return CrossingSignInternal(d);
}